

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O2

void cmFortranParser_RuleModule(cmFortranParser *parser,char *module_name)

{
  cmFortranSourceInfo *pcVar1;
  allocator<char> local_49;
  string local_48;
  string local_28;
  
  if ((parser->InPPFalseBranch == 0) && (parser->InInterface == false)) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,module_name,&local_49);
    cmsys::SystemTools::LowerCase(&local_28,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    pcVar1 = parser->Info;
    std::operator+(&local_48,&local_28,".mod");
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&pcVar1->Provides,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
  }
  return;
}

Assistant:

void cmFortranParser_RuleModule(cmFortranParser* parser,
                                const char* module_name)
{
  if (parser->InPPFalseBranch) {
    return;
  }

  if (!parser->InInterface) {
    // syntax:   "module module_name"
    // provides: "module_name.mod"
    std::string const& mod_name = cmSystemTools::LowerCase(module_name);
    parser->Info.Provides.insert(parser->ModName(mod_name));
  }
}